

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minireflect.h
# Opt level: O1

char * flatbuffers::EnumName<unsigned_int>(uint tval,TypeTable *type_table)

{
  ulong uVar1;
  ulong uVar2;
  
  if ((type_table != (TypeTable *)0x0) && (type_table->names != (char **)0x0)) {
    uVar1 = type_table->num_elems;
    uVar2 = (ulong)tval;
    if (type_table->values != (int64_t *)0x0) {
      if (uVar1 != 0) {
        uVar2 = 0;
        do {
          if (type_table->values[uVar2] == (ulong)tval) goto LAB_00193e05;
          uVar2 = uVar2 + 1;
        } while (uVar1 != uVar2);
      }
      uVar2 = 0xffffffffffffffff;
    }
LAB_00193e05:
    if ((long)uVar2 < (long)uVar1 && -1 < (long)uVar2) {
      return type_table->names[uVar2];
    }
  }
  return (char *)0x0;
}

Assistant:

const char *EnumName(T tval, const TypeTable *type_table) {
  if (!type_table || !type_table->names) return nullptr;
  auto i = LookupEnum(static_cast<int64_t>(tval), type_table->values,
                      type_table->num_elems);
  if (i >= 0 && i < static_cast<int64_t>(type_table->num_elems)) {
    return type_table->names[i];
  }
  return nullptr;
}